

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O1

bool __thiscall ON_ParseSettings::IsDecimalExponentSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  if ((int)c < 100) {
    if (c != 0x44) {
      if (c == 0x45) {
        return true;
      }
      return false;
    }
  }
  else {
    if ((c == 0x23e8) || (c == 0x65)) {
      return true;
    }
    if (c != 100) {
      return false;
    }
  }
  return (bool)((byte)this->m_false_default_bits[0] & 1);
}

Assistant:

bool ON_ParseSettings::IsDecimalExponentSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case 'e': // lower case e
  case 'E': // capital E
  case 0x23E8: // decimal exponent symbol
    return true;
    break;

  case 'D': // capital D
  case 'd': // lower case d
    return ParseDAsExponentInScientificENotation();
    break;
  }
  return false;
}